

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void set_bang(t_set *x)

{
  t_gpointer *gp;
  char cVar1;
  uint uVar2;
  char *pcVar3;
  anon_union_8_2_d3a68b8d_for_gs_un *paVar4;
  int iVar5;
  t_symbol *ptVar6;
  t_symbol *ptVar7;
  t_template *x_00;
  ulong uVar8;
  t_setvariable *ptVar9;
  _inlet *x_01;
  t_symbol *s;
  ulong uVar10;
  t_word *wp;
  t_gstub *ptVar11;
  
  uVar2 = x->x_nin;
  gp = &x->x_gp;
  ptVar11 = (x->x_gp).gp_stub;
  iVar5 = gpointer_check(gp,0);
  if (iVar5 == 0) {
    pd_error(x,"set: empty pointer");
    return;
  }
  ptVar7 = x->x_templatesym;
  cVar1 = *ptVar7->s_name;
  ptVar6 = gpointer_gettemplatesym(gp);
  s = ptVar6;
  if ((cVar1 != '\0') && (s = ptVar7, ptVar7 != ptVar6)) {
    pcVar3 = ptVar7->s_name;
    ptVar7 = gpointer_gettemplatesym(gp);
    pd_error(x,"set %s: got wrong template (%s)",pcVar3,ptVar7->s_name);
    return;
  }
  x_00 = template_findbyname(s);
  if (x_00 == (t_template *)0x0) {
    pd_error(x,"set: couldn\'t find template %s",s->s_name);
    return;
  }
  if (uVar2 == 0) {
    return;
  }
  uVar8 = 0;
  uVar10 = 0x18;
  if (ptVar11->gs_which == 2) {
    uVar10 = uVar8;
  }
  ptVar9 = x->x_variables;
  wp = (t_word *)((long)((x->x_gp).gp_un.gp_scalar)->sc_vec + (uVar10 - 0x18));
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  if (x->x_issymbol == 0) {
    while (iVar5 = (int)uVar8, uVar8 = (ulong)(iVar5 - 1), iVar5 != 0) {
      template_setfloat(x_00,ptVar9->gv_sym,wp,(ptVar9->gv_w).w_float,1);
      ptVar9 = ptVar9 + 1;
    }
  }
  else {
    while (iVar5 = (int)uVar8, uVar8 = (ulong)(iVar5 - 1), iVar5 != 0) {
      template_setsymbol(x_00,ptVar9->gv_sym,wp,(ptVar9->gv_w).w_symbol,1);
      ptVar9 = ptVar9 + 1;
    }
  }
  if (ptVar11->gs_which == 1) {
    x_01 = (_inlet *)(gp->gp_un).gp_scalar;
  }
  else {
    do {
      paVar4 = &ptVar11->gs_un;
      ptVar11 = (t_gstub *)paVar4->gs_glist->gl_list;
    } while (ptVar11->gs_which == 2);
    x_01 = (paVar4->gs_glist->gl_obj).te_inlet;
  }
  scalar_redraw((t_scalar *)x_01,(ptVar11->gs_un).gs_glist);
  return;
}

Assistant:

static void set_bang(t_set *x)
{
    int nitems = x->x_nin, i;
    t_symbol *templatesym;
    t_template *template;
    t_setvariable *vp;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "set: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) != gpointer_gettemplatesym(gp))
        {
            pd_error(x, "set %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "set: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!nitems)
        return;
    if (gs->gs_which == GP_ARRAY)
        vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    if (x->x_issymbol)
        for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
            template_setsymbol(template, vp->gv_sym, vec, vp->gv_w.w_symbol, 1);
    else for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
        template_setfloat(template, vp->gv_sym, vec, vp->gv_w.w_float, 1);
    if (gs->gs_which == GP_GLIST)
        scalar_redraw(gp->gp_un.gp_scalar, gs->gs_un.gs_glist);
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        scalar_redraw(owner_array->a_gp.gp_un.gp_scalar,
            owner_array->a_gp.gp_stub->gs_un.gs_glist);
    }
}